

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O2

uint compute_correct(map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *ref,map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *hyp,uint len)

{
  int iVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  uint uVar4;
  uint uVar5;
  uint local_40;
  uint local_3c;
  _Base_ptr local_38;
  
  local_38 = &(ref->_M_t)._M_impl.super__Rb_tree_header._M_header;
  uVar5 = 0;
  uVar4 = 0;
  while( true ) {
    if (len == uVar4) {
      return uVar5;
    }
    local_3c = uVar4;
    cVar2 = std::
            _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&ref->_M_t,(key_type *)&local_3c);
    local_40 = uVar4;
    cVar3 = std::
            _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&hyp->_M_t,(key_type *)&local_40);
    if (cVar2._M_node == local_38) break;
    if ((_Rb_tree_header *)cVar3._M_node == &(hyp->_M_t)._M_impl.super__Rb_tree_header) {
      __assert_fail("hi != hyp.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/clab[P]stack-lstm-ner/ner-system/lstm-parse.cc"
                    ,0x294,
                    "unsigned int compute_correct(const map<int, string> &, const map<int, string> &, unsigned int)"
                   );
    }
    iVar1 = std::__cxx11::string::compare((string *)&cVar2._M_node[1]._M_parent);
    uVar5 = uVar5 + (iVar1 == 0);
    uVar4 = uVar4 + 1;
  }
  __assert_fail("ri != ref.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/clab[P]stack-lstm-ner/ner-system/lstm-parse.cc"
                ,0x293,
                "unsigned int compute_correct(const map<int, string> &, const map<int, string> &, unsigned int)"
               );
}

Assistant:

unsigned compute_correct(const map<int,string>& ref, const map<int,string>& hyp, unsigned len) {
  unsigned res = 0;
  for (unsigned i = 0; i < len; ++i) {
    auto ri = ref.find(i);
    auto hi = hyp.find(i);
    assert(ri != ref.end());
    assert(hi != hyp.end());
    if (ri->second.compare(hi->second)==0) ++res;
  }
  return res;
}